

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O3

_Bool trans_VCMP_dp(DisasContext_conflict1 *s,arg_VCMP_dp *a)

{
  uint uVar1;
  TCGContext_conflict1 *s_00;
  _Bool _Var2;
  TCGTemp *ts;
  TCGTemp *ts_00;
  _Bool _Var3;
  code *func;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGv_ptr local_38;
  
  uVar1 = s->isar->mvfr0;
  if ((((uVar1 & 0xf00) == 0) || ((s_00 = s->uc->tcg_ctx, a->z != 0 && (a->vm != 0)))) ||
     (((uVar1 & 0xe) == 0 && (((a->vm | a->vd) & 0x10U) != 0)))) {
    _Var3 = false;
  }
  else {
    _Var2 = full_vfp_access_check(s,false);
    _Var3 = true;
    if (_Var2) {
      ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      ts_00 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i64,(TCGArg)ts,(TCGArg)(s_00->cpu_env + (long)s_00),
                          (ulong)((uint)a->vd >> 1) * 0x100 + (ulong)(a->vd & 1) * 8 + 0xc10);
      if (a->z == 0) {
        tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i64,(TCGArg)ts_00,(TCGArg)(s_00->cpu_env + (long)s_00),
                            (ulong)((uint)a->vm >> 1) * 0x100 + (ulong)(a->vm & 1) * 8 + 0xc10);
      }
      else {
        tcg_gen_op2_aarch64(s_00,INDEX_op_movi_i64,(TCGArg)ts_00,0);
      }
      local_38 = s_00->cpu_env + (long)s_00;
      if (a->e == 0) {
        func = helper_vfp_cmpd_aarch64;
      }
      else {
        func = helper_vfp_cmped_aarch64;
      }
      local_48 = ts;
      local_40 = ts_00;
      tcg_gen_callN_aarch64(s_00,func,(TCGTemp *)0x0,3,&local_48);
      tcg_temp_free_internal_aarch64(s_00,ts);
      tcg_temp_free_internal_aarch64(s_00,ts_00);
    }
  }
  return _Var3;
}

Assistant:

static bool trans_VCMP_dp(DisasContext *s, arg_VCMP_dp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 vd, vm;

    if (!dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }

    /* Vm/M bits must be zero for the Z variant */
    if (a->z && a->vm != 0) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist. */
    if (!dc_isar_feature(aa32_simd_r32, s) && ((a->vd | a->vm) & 0x10)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    vd = tcg_temp_new_i64(tcg_ctx);
    vm = tcg_temp_new_i64(tcg_ctx);

    neon_load_reg64(tcg_ctx, vd, a->vd);
    if (a->z) {
        tcg_gen_movi_i64(tcg_ctx, vm, 0);
    } else {
        neon_load_reg64(tcg_ctx, vm, a->vm);
    }

    if (a->e) {
        gen_helper_vfp_cmped(tcg_ctx, vd, vm, tcg_ctx->cpu_env);
    } else {
        gen_helper_vfp_cmpd(tcg_ctx, vd, vm, tcg_ctx->cpu_env);
    }

    tcg_temp_free_i64(tcg_ctx, vd);
    tcg_temp_free_i64(tcg_ctx, vm);

    return true;
}